

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O0

void Vec_PtrRemove(Vec_Ptr_t *p,void *Entry)

{
  int iVar1;
  bool bVar2;
  int local_1c;
  int i;
  void *Entry_local;
  Vec_Ptr_t *p_local;
  
  local_1c = p->nSize;
  do {
    iVar1 = local_1c;
    local_1c = iVar1 + -1;
    if (local_1c < 0) break;
  } while (p->pArray[local_1c] != Entry);
  bVar2 = local_1c < 0;
  local_1c = iVar1;
  if (bVar2) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
  }
  for (; local_1c < p->nSize; local_1c = local_1c + 1) {
    p->pArray[local_1c + -1] = p->pArray[local_1c];
  }
  p->nSize = p->nSize + -1;
  return;
}

Assistant:

static inline void Vec_PtrRemove( Vec_Ptr_t * p, void * Entry )
{
    int i;
    // delete assuming that it is closer to the end
    for ( i = p->nSize - 1; i >= 0; i-- )
        if ( p->pArray[i] == Entry )
            break;
    assert( i >= 0 );
/*
    // delete assuming that it is closer to the beginning
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            break;
    assert( i < p->nSize );
*/
    for ( i++; i < p->nSize; i++ )
        p->pArray[i-1] = p->pArray[i];
    p->nSize--;
}